

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEnginePrivate::nativeListen(QNativeSocketEnginePrivate *this,int backlog)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = ::listen((int)this->socketDescriptor,backlog);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x62) {
      setError(this,AddressInUseError,PortInuseErrorString);
    }
  }
  else {
    (this->super_QAbstractSocketEnginePrivate).socketState = ListeningState;
  }
  return -1 < iVar1;
}

Assistant:

bool QNativeSocketEnginePrivate::nativeListen(int backlog)
{
    if (qt_safe_listen(socketDescriptor, backlog) < 0) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        int ecopy = errno;
#endif
        switch (errno) {
        case EADDRINUSE:
            setError(QAbstractSocket::AddressInUseError,
                     PortInuseErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::nativeListen(%i) == false (%s)",
               backlog, strerror(ecopy));
#endif
        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeListen(%i) == true", backlog);
#endif

    socketState = QAbstractSocket::ListeningState;
    return true;
}